

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  int32_t node_00;
  iterator __position;
  pointer pNVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  pair<float,_int> __value;
  pointer ppVar3;
  long lVar4;
  real x;
  double dVar5;
  _Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> __cmp;
  pair<float,_int> local_48;
  real local_3c;
  ulong local_38;
  
  local_38 = (ulong)k;
  while( true ) {
    ppVar3 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current - (long)ppVar3 >> 3 == local_38) && (score < ppVar3->first)) {
      return;
    }
    lVar4 = (long)node;
    pNVar1 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pNVar1[lVar4].left == -1) && (pNVar1[lVar4].right == -1)) break;
    x = Matrix::dotRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,hidden,lVar4 - this->osz_);
    local_3c = utils::sigmoid(x);
    node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4].left;
    dVar5 = utils::log((double)(ulong)(uint)(1.0 - local_3c));
    dfs(this,k,node_00,SUB84(dVar5,0) + score,heap,hidden);
    node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4].right;
    dVar5 = utils::log((double)(ulong)(uint)local_3c);
    score = score + SUB84(dVar5,0);
  }
  local_48.second = node;
  local_48.first = score;
  if (__position._M_current ==
      (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
    _M_realloc_insert<std::pair<float,int>>
              ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,__position,
               &local_48);
    ppVar3 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->first = score;
    (__position._M_current)->second = node;
    ppVar3 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish + 1;
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  _Var2._M_current =
       (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48 = (pair<float,_int>)comparePairs;
  std::
  __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
            (_Var2,((long)ppVar3 - (long)_Var2._M_current >> 3) + -1,0,ppVar3[-1],
             (_Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
              *)&local_48);
  _Var2._M_current =
       (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (local_38 < (ulong)((long)ppVar3 - (long)_Var2._M_current >> 3)) {
    if (8 < (long)ppVar3 - (long)_Var2._M_current) {
      __value = ppVar3[-1];
      ppVar3[-1].first = (_Var2._M_current)->first;
      ppVar3[-1].second = (_Var2._M_current)->second;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                (_Var2,0,(long)ppVar3 + (-8 - (long)_Var2._M_current) >> 3,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                  )comparePairs);
      ppVar3 = (heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
  }
  return;
}

Assistant:

void Model::dfs(int32_t k, int32_t node, real score,
                std::vector<std::pair<real, int32_t>>& heap,
                Vector& hidden) const {
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree[node].left == -1 && tree[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = utils::sigmoid(wo_->dotRow(hidden, node - osz_));
  dfs(k, tree[node].left, score + utils::log(1.0 - f), heap, hidden);
  dfs(k, tree[node].right, score + utils::log(f), heap, hidden);
}